

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QString * toStringTextDate(QString *__return_storage_ptr__,QDate date)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  int day;
  QTypedArrayData<char16_t> *__old_val_1;
  longlong __old_val_2;
  QTypedArrayData<char16_t> *__old_val;
  long in_FS_OFFSET;
  YearMonthDay YVar7;
  QCalendar cal;
  QArrayData *local_178;
  char16_t *pcStack_170;
  qsizetype local_168;
  QLocale local_158;
  QString local_150;
  QLocale local_138;
  QString local_130;
  QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString> local_118;
  QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString> local_e0;
  QLatin1Char *local_a8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
  local_a0;
  QLatin1Char local_41;
  QCalendar local_40;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
    local_40.d_ptr = (QCalendarBackend *)&DAT_aaaaaaaaaaaaaaaa;
    QCalendar::QCalendar(&local_40);
    YVar7 = QCalendar::partsFromDate(&local_40,date);
    if (YVar7._0_8_ >> 0x20 != 0x80000000) {
      local_41.ch = ' ';
      QLocale::QLocale(&local_138,C,AnyScript,AnyCountry);
      day = QCalendar::dayOfWeek(&local_40,date);
      QLocale::dayName(&local_130,&local_138,day,ShortFormat);
      qVar6 = local_130.d.size;
      pcVar5 = local_130.d.ptr;
      pDVar4 = local_130.d.d;
      local_130.d.d = (Data *)0x0;
      local_130.d.ptr = (char16_t *)0x0;
      local_130.d.size = 0;
      QLocale::QLocale(&local_158,C,AnyScript,AnyCountry);
      QCalendar::monthName(&local_150,&local_40,&local_158,YVar7.month,YVar7.year,ShortFormat);
      qVar3 = local_150.d.size;
      pcVar2 = local_150.d.ptr;
      pDVar1 = local_150.d.d;
      local_118.a.b = &local_41;
      local_150.d.d = (Data *)0x0;
      local_150.d.ptr = (char16_t *)0x0;
      local_150.d.size = 0;
      local_118.a.a.d.d = (Data *)0x0;
      local_e0.a.a.d.d = pDVar4;
      local_118.a.a.d.ptr = (char16_t *)0x0;
      local_118.a.a.d.size = 0;
      local_e0.a.a.d.ptr = pcVar5;
      local_e0.a.a.d.size = qVar6;
      local_118.b.d.d = (Data *)0x0;
      local_e0.b.d.d = pDVar1;
      local_118.b.d.ptr = (char16_t *)0x0;
      local_118.b.d.size = 0;
      local_e0.b.d.ptr = pcVar2;
      local_e0.b.d.size = qVar3;
      local_e0.a.b = local_118.a.b;
      local_a8 = local_118.a.b;
      QString::asprintf((char **)&local_178,"%d %04d",(ulong)(uint)YVar7.day,YVar7._0_8_);
      local_a0.b.d.size = local_168;
      local_a0.b.d.ptr = pcStack_170;
      local_a0.b.d.d = (Data *)local_178;
      local_e0.a.a.d.d = (Data *)0x0;
      local_e0.a.a.d.ptr = (char16_t *)0x0;
      local_a0.a.a.a.a.d.d = pDVar4;
      local_a0.a.a.a.a.d.ptr = pcVar5;
      local_e0.a.a.d.size = 0;
      local_a0.a.a.a.a.d.size = qVar6;
      local_a0.a.a.a.b = &local_41;
      local_e0.b.d.d = (Data *)0x0;
      local_a0.a.a.b.d.d = pDVar1;
      local_e0.b.d.ptr = (char16_t *)0x0;
      local_e0.b.d.size = 0;
      local_a0.a.a.b.d.ptr = pcVar2;
      local_a0.a.a.b.d.size = qVar3;
      local_178 = (QArrayData *)0x0;
      pcStack_170 = (char16_t *)0x0;
      local_168 = 0;
      local_a0.a.b = local_a0.a.a.a.b;
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
      ::convertTo<QString>(__return_storage_ptr__,&local_a0);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
      ::~QStringBuilder(&local_a0);
      if (local_178 != (QArrayData *)0x0) {
        LOCK();
        (local_178->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_178->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_178->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_178,2,0x10);
        }
      }
      QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>::~QStringBuilder
                (&local_e0);
      QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>::~QStringBuilder
                (&local_118);
      if (&(local_150.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_150.d.d)->super_QArrayData,2,0x10);
        }
      }
      QLocale::~QLocale(&local_158);
      if (&(local_130.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_130.d.d)->super_QArrayData,2,0x10);
        }
      }
      QLocale::~QLocale(&local_138);
      goto LAB_003454c8;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_003454c8:
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString toStringTextDate(QDate date)
{
    if (date.isValid()) {
        QCalendar cal; // Always Gregorian
        const auto parts = cal.partsFromDate(date);
        if (parts.isValid()) {
            const QLatin1Char sp(' ');
            return QLocale::c().dayName(cal.dayOfWeek(date), QLocale::ShortFormat) + sp
                + cal.monthName(QLocale::c(), parts.month, parts.year, QLocale::ShortFormat)
                // Documented to use 4-digit year
                + sp + QString::asprintf("%d %04d", parts.day, parts.year);
        }
    }
    return QString();
}